

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeEncodingSynapse.cpp
# Opt level: O2

void __thiscall BSA_SpikeEncodingSynapse::update(BSA_SpikeEncodingSynapse *this)

{
  double dVar1;
  double dVar2;
  Population *pPVar3;
  reference pdVar4;
  Event *pEVar5;
  SpikeEvent *this_00;
  int j;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  Clock::getCurrentTime(this->clock);
  resetOutput(this);
  for (uVar7 = 0; (long)uVar7 < (long)this->inputSize; uVar7 = uVar7 + 1) {
    pEVar5 = (((this->super_Synapse).from_population)->output).
             super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar7];
    if (pEVar5->type == Value) {
      std::deque<double,_std::allocator<double>_>::push_back
                ((this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,
                 (value_type_conflict3 *)(pEVar5 + 1));
      std::deque<double,_std::allocator<double>_>::pop_front
                ((this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7);
      dVar8 = 0.0;
      dVar9 = 0.0;
      for (lVar6 = 0; (double)(int)lVar6 < this->param->filter_length; lVar6 = lVar6 + 1) {
        pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           (&(this->input).
                             super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start,lVar6);
        dVar1 = *pdVar4;
        dVar2 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           (&(this->input).
                             super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start,lVar6);
        dVar8 = dVar8 + ABS(dVar1 - dVar2);
        dVar9 = dVar9 + ABS(*pdVar4);
      }
      if (dVar8 <= dVar9 - this->param->threshold) {
        this_00 = (SpikeEvent *)operator_new(0x28);
        SpikeEvent::SpikeEvent(this_00);
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = (Event *)this_00;
        (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7]->_vptr_Event)(0x408c200000000000);
        Logging::logEvent(this->logger,(long)this,(int)uVar7,
                          (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar7]->type);
        for (lVar6 = 0; (double)(int)lVar6 < this->param->filter_length; lVar6 = lVar6 + 1) {
          dVar8 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                             (&(this->input).
                               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar7].
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start,lVar6);
          *pdVar4 = *pdVar4 - dVar8;
        }
      }
      else {
        pEVar5 = (Event *)operator_new(0x18);
        NoEvent::NoEvent((NoEvent *)pEVar5);
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = pEVar5;
      }
      pPVar3 = (this->super_Synapse).to_population;
      (*pPVar3->_vptr_Population[5])
                (pPVar3,uVar7 & 0xffffffff,
                 (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7]);
    }
  }
  return;
}

Assistant:

void BSA_SpikeEncodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    resetOutput();
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Value) {
            input[i].push_back(static_cast<ValueEvent*>(from_population->output[i])->value);
            input[i].pop_front();
            double error1 = 0;
            double error2 = 0;
            // Ben's Spiker Algorithm
            for(int j = 0; j < param->filter_length; j++) {
                error1 += abs(input[i][j] - filter[j]);
                error2 += abs(input[i][j]);
            }
            if(error1 <= (error2 - param->threshold)) {
                output[i] = new SpikeEvent();
                output[i]->setWeight(900.0);
                logger->logEvent((long)this, i, output[i]->type);
                for(int j = 0; j < param->filter_length; j++) {
                    input[i][j] -= filter[j];
                }
            }
            else {
                output[i] = new NoEvent();
            }
            to_population->setInput(i, output[i]);
        }
    }
}